

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::SimpleDescriptorDatabaseExtraTest_FindAllFileNames_Test::TestBody
          (SimpleDescriptorDatabaseExtraTest_FindAllFileNames_Test *this)

{
  bool bVar1;
  uint32_t *puVar2;
  Arena *pAVar3;
  DescriptorProto *this_00;
  char *message;
  _Head_base<0UL,_const_char_*,_false> in_stack_fffffffffffffd70;
  AssertHelper local_210;
  Message local_208;
  testing local_200 [8];
  char local_1f8 [8];
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  all_files;
  SimpleDescriptorDatabase db;
  undefined1 local_150 [8];
  FileDescriptorProto f;
  SimpleDescriptorDatabaseExtraTest_FindAllFileNames_Test *this_local;
  
  f.field_0._224_8_ = this;
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_150);
  puVar2 = internal::HasBits<1>::operator[]
                     ((HasBits<1> *)&f.super_Message.super_MessageLite._internal_metadata_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 1;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)local_150);
  internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)
             &f.field_0._impl_.option_dependency_.super_RepeatedPtrFieldBase.arena_,"foo.proto",
             pAVar3);
  puVar2 = internal::HasBits<1>::operator[]
                     ((HasBits<1> *)&f.super_Message.super_MessageLite._internal_metadata_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 2;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)local_150);
  internal::ArenaStringPtr::Set(&f.field_0._impl_.name_,"foo",pAVar3);
  this_00 = FileDescriptorProto::add_message_type((FileDescriptorProto *)local_150);
  puVar2 = internal::HasBits<1>::operator[](&(this_00->field_0)._impl_._has_bits_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 1;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)this_00);
  internal::ArenaStringPtr::Set(&(this_00->field_0)._impl_.name_,"Foo",pAVar3);
  SimpleDescriptorDatabase::SimpleDescriptorDatabase
            ((SimpleDescriptorDatabase *)
             &all_files.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  SimpleDescriptorDatabase::Add
            ((SimpleDescriptorDatabase *)
             &all_files.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(FileDescriptorProto *)local_150);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&gtest_ar.message_);
  SimpleDescriptorDatabase::FindAllFileNames
            ((SimpleDescriptorDatabase *)
             &all_files.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&gtest_ar.message_);
  testing::ElementsAre<char[10]>(local_200,(char (*) [10])0x1e1d402);
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*>>>
            ((ElementsAreMatcher<std::tuple<const_char_*>_>)in_stack_fffffffffffffd70._M_head_impl);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<char_const*>>>::
  operator()(local_1f0,local_1f8,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)"all_files");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
  if (!bVar1) {
    testing::Message::Message(&local_208);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_database_unittest.cc"
               ,0x1f7,message);
    testing::internal::AssertHelper::operator=(&local_210,&local_208);
    testing::internal::AssertHelper::~AssertHelper(&local_210);
    testing::Message::~Message(&local_208);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&gtest_ar.message_);
  SimpleDescriptorDatabase::~SimpleDescriptorDatabase
            ((SimpleDescriptorDatabase *)
             &all_files.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_150);
  return;
}

Assistant:

TEST(SimpleDescriptorDatabaseExtraTest, FindAllFileNames) {
  FileDescriptorProto f;
  f.set_name("foo.proto");
  f.set_package("foo");
  f.add_message_type()->set_name("Foo");

  SimpleDescriptorDatabase db;
  db.Add(f);

  // Test!
  std::vector<std::string> all_files;
  db.FindAllFileNames(&all_files);
  EXPECT_THAT(all_files, testing::ElementsAre("foo.proto"));
}